

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setNegativeSuffix(DecimalFormat *this,UnicodeString *newValue)

{
  UBool UVar1;
  DecimalFormatProperties *pDVar2;
  UnicodeString *newValue_local;
  DecimalFormat *this_local;
  
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = UnicodeString::operator==(newValue,&pDVar2->negativeSuffix);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UnicodeString::operator=(&pDVar2->negativeSuffix,newValue);
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setNegativeSuffix(const UnicodeString& newValue) {
    if (newValue == fields->properties->negativeSuffix) { return; }
    fields->properties->negativeSuffix = newValue;
    touchNoError();
}